

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-trapezoid-tessellator.cpp
# Opt level: O1

bool __thiscall
gepard::SegmentApproximator::curveIsLineSegment(SegmentApproximator *this,FloatPoint *points)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar1 = points->x;
  dVar2 = points->y;
  dVar3 = points[1].x;
  dVar4 = points[1].y;
  dVar10 = points[3].x;
  dVar8 = points[3].y;
  dVar5 = this->kTolerance;
  if (ABS((dVar2 - dVar4) * (dVar10 - dVar1) - (dVar1 - dVar3) * (dVar8 - dVar2)) <= dVar5) {
    dVar6 = points[2].x;
    dVar7 = points[2].y;
    if (ABS((dVar10 - dVar1) * (dVar2 - dVar7) - (dVar8 - dVar2) * (dVar1 - dVar6)) <= dVar5) {
      dVar9 = dVar10;
      if (dVar10 <= dVar1) {
        dVar9 = dVar1;
        dVar1 = dVar10;
      }
      dVar10 = dVar2;
      if (dVar8 <= dVar2) {
        dVar10 = dVar8;
      }
      if (dVar8 <= dVar2) {
        dVar8 = dVar2;
      }
      return (bool)((dVar7 <= dVar8 + dVar5 && (dVar10 - dVar5 <= dVar7 && dVar6 <= dVar9 + dVar5))
                   & (dVar1 - dVar5 <= dVar6 && (dVar4 <= dVar8 + dVar5 && dVar10 - dVar5 <= dVar4))
                     & -(dVar1 - dVar5 <= dVar3) & -(dVar3 <= dVar9 + dVar5));
    }
  }
  return false;
}

Assistant:

const bool SegmentApproximator::curveIsLineSegment(FloatPoint points[])
{
    const Float x0 = points[0].x;
    const Float y0 = points[0].y;
    const Float x1 = points[1].x;
    const Float y1 = points[1].y;
    const Float x2 = points[2].x;
    const Float y2 = points[2].y;
    const Float x3 = points[3].x;
    const Float y3 = points[3].y;

    const Float dt1 = std::fabs((x3 - x0) * (y0 - y1) - (x0 - x1) * (y3 - y0));
    const Float dt2 = std::fabs((x3 - x0) * (y0 - y2) - (x0 - x2) * (y3 - y0));

    if (dt1 > kTolerance || dt2 > kTolerance)
        return false;

    Float minX, minY, maxX, maxY;

    if (x0 < x3) {
        minX = x0 - kTolerance;
        maxX = x3 + kTolerance;
    } else {
        minX = x3 - kTolerance;
        maxX = x0 + kTolerance;
    }

    if (y0 < y3) {
        minY = y0 - kTolerance;
        maxY = y3 + kTolerance;
    } else {
        minY = y3 - kTolerance;
        maxY = y0 + kTolerance;
    }

    return !(x1 < minX || x1 > maxX || y1 < minY || y1 > maxY
             || x2 < minX || x2 > maxX || y2 < minY || y2 > maxY);
}